

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t2.c
# Opt level: O1

OPJ_BOOL opj_t2_encode_packets
                   (opj_t2_t *p_t2,OPJ_UINT32 p_tile_no,opj_tcd_tile_t *p_tile,
                   OPJ_UINT32 p_maxlayers,OPJ_BYTE *p_dest,OPJ_UINT32 *p_data_written,
                   OPJ_UINT32 p_max_len,opj_codestream_info_t *cstr_info,
                   opj_tcd_marker_info_t *p_marker_info,OPJ_UINT32 p_tp_num,OPJ_INT32 p_tp_pos,
                   OPJ_UINT32 p_pino,J2K_T2_MODE p_t2_mode,opj_event_mgr_t *p_manager)

{
  uint uVar1;
  opj_image_t *p_image;
  bool bVar2;
  OPJ_UINT32 OVar3;
  int iVar4;
  OPJ_BOOL OVar5;
  opj_pi_iterator_t *poVar6;
  OPJ_UINT32 *pOVar7;
  opj_packet_info_t *poVar8;
  long lVar9;
  opj_pi_iterator_t *pi;
  OPJ_UINT32 OVar10;
  uint uVar11;
  OPJ_BYTE *pOVar12;
  bool bVar13;
  OPJ_UINT32 l_nb_bytes;
  opj_pi_iterator_t *local_78;
  OPJ_UINT32 local_6c;
  OPJ_UINT32 local_68;
  OPJ_UINT16 local_62;
  opj_cp_t *local_60;
  OPJ_BYTE *local_58;
  uint local_4c;
  opj_tcp_t *local_48;
  OPJ_UINT32 *local_40;
  opj_tcd_tile_t *local_38;
  
  l_nb_bytes = 0;
  p_image = p_t2->image;
  local_60 = p_t2->cp;
  pOVar12 = (OPJ_BYTE *)(ulong)p_tile_no;
  local_48 = local_60->tcps + (long)pOVar12;
  if ((local_60->m_specific_param).m_dec.m_reduce == 0) {
    local_6c = 1;
  }
  else {
    local_6c = p_image->numcomps;
  }
  local_62 = local_60->rsiz;
  OVar10 = local_48->numpocs;
  local_4c = p_maxlayers;
  local_40 = p_data_written;
  local_38 = p_tile;
  poVar6 = opj_pi_initialise_encode(p_image,local_60,p_tile_no,p_t2_mode,p_manager);
  if (poVar6 == (opj_pi_iterator_t *)0x0) {
    return 0;
  }
  OVar10 = OVar10 + 1;
  *local_40 = 0;
  local_78 = poVar6;
  local_58 = pOVar12;
  if (p_t2_mode == THRESH_CALC) {
    OVar5 = 1;
    if (local_6c != 0) {
      local_68 = 0;
      pi = poVar6;
      local_58 = p_dest;
      do {
        bVar13 = true;
        uVar11 = 0;
        OVar3 = 0;
        poVar6 = pi;
        do {
          opj_pi_create_encode(poVar6,local_60,p_tile_no,OVar3,local_68,p_tp_pos,THRESH_CALC);
          if ((pi->poc).prg == OPJ_PROG_UNKNOWN) {
            opj_pi_destroy(poVar6,OVar10);
            bVar2 = false;
          }
          else {
            iVar4 = opj_pi_next(pi);
            poVar6 = local_78;
            pOVar12 = local_58;
            while (local_78 = poVar6, iVar4 != 0) {
              if (pi->layno < local_4c) {
                l_nb_bytes = 0;
                OVar5 = opj_t2_encode_packet
                                  (p_tile_no,local_38,local_48,pi,pOVar12,&l_nb_bytes,p_max_len,
                                   cstr_info,THRESH_CALC,p_manager);
                if (OVar5 == 0) goto LAB_0013f589;
                uVar11 = uVar11 + l_nb_bytes;
                pOVar12 = pOVar12 + l_nb_bytes;
                p_max_len = p_max_len - l_nb_bytes;
                *local_40 = *local_40 + l_nb_bytes;
              }
              iVar4 = opj_pi_next(pi);
              poVar6 = local_78;
            }
            uVar1 = (local_60->m_specific_param).m_dec.m_reduce;
            if ((uVar1 == 0) || (uVar11 <= uVar1)) {
              pi = pi + 1;
              bVar2 = true;
              local_58 = pOVar12;
            }
            else {
LAB_0013f589:
              poVar6 = local_78;
              local_58 = pOVar12;
              opj_pi_destroy(local_78,OVar10);
              bVar2 = false;
            }
          }
          if (!bVar2) break;
          bVar13 = OVar3 == 0;
          OVar3 = OVar3 + 1;
          bVar13 = bVar13 && local_62 == 4;
        } while (bVar13);
        if (bVar13) {
          return 0;
        }
        local_68 = local_68 + 1;
        pi = poVar6;
      } while (local_68 != local_6c);
      OVar5 = 1;
    }
    goto LAB_0013f611;
  }
  opj_pi_create_encode(poVar6,local_60,p_tile_no,p_pino,p_tp_num,p_tp_pos,p_t2_mode);
  if (local_78[p_pino].poc.prg == OPJ_PROG_UNKNOWN) {
LAB_0013f5fe:
    OVar5 = 0;
    poVar6 = local_78;
  }
  else {
    if ((p_marker_info != (opj_tcd_marker_info_t *)0x0) && (p_marker_info->need_PLT != 0)) {
      if (p_marker_info->packet_count != 0) {
        __assert_fail("p_marker_info->packet_count == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/t2.c"
                      ,0x13d,
                      "OPJ_BOOL opj_t2_encode_packets(opj_t2_t *, OPJ_UINT32, opj_tcd_tile_t *, OPJ_UINT32, OPJ_BYTE *, OPJ_UINT32 *, OPJ_UINT32, opj_codestream_info_t *, opj_tcd_marker_info_t *, OPJ_UINT32, OPJ_INT32, OPJ_UINT32, J2K_T2_MODE, opj_event_mgr_t *)"
                     );
      }
      if (p_marker_info->p_packet_size != (OPJ_UINT32 *)0x0) {
        __assert_fail("p_marker_info->p_packet_size == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/t2.c"
                      ,0x13e,
                      "OPJ_BOOL opj_t2_encode_packets(opj_t2_t *, OPJ_UINT32, opj_tcd_tile_t *, OPJ_UINT32, OPJ_BYTE *, OPJ_UINT32 *, OPJ_UINT32, opj_codestream_info_t *, opj_tcd_marker_info_t *, OPJ_UINT32, OPJ_INT32, OPJ_UINT32, J2K_T2_MODE, opj_event_mgr_t *)"
                     );
      }
      OVar3 = opj_get_encoding_packet_count(p_image,local_60,p_tile_no);
      pOVar7 = (OPJ_UINT32 *)opj_malloc((ulong)OVar3 << 2);
      p_marker_info->p_packet_size = pOVar7;
      if (pOVar7 == (OPJ_UINT32 *)0x0) goto LAB_0013f5fe;
    }
    poVar6 = poVar6 + p_pino;
    iVar4 = opj_pi_next(poVar6);
    pOVar12 = local_58;
    while (iVar4 != 0) {
      if (poVar6->layno < local_4c) {
        l_nb_bytes = 0;
        OVar5 = opj_t2_encode_packet
                          (p_tile_no,local_38,local_48,poVar6,p_dest,&l_nb_bytes,p_max_len,cstr_info
                           ,p_t2_mode,p_manager);
        if (OVar5 == 0) goto LAB_0013f5fe;
        *local_40 = *local_40 + l_nb_bytes;
        if ((p_marker_info != (opj_tcd_marker_info_t *)0x0) && (p_marker_info->need_PLT != 0)) {
          p_marker_info->p_packet_size[p_marker_info->packet_count] = l_nb_bytes;
          p_marker_info->packet_count = p_marker_info->packet_count + 1;
        }
        if (cstr_info != (opj_codestream_info_t *)0x0) {
          if (cstr_info->index_write != 0) {
            poVar8 = cstr_info->tile[(long)pOVar12].packet + cstr_info->packno;
            if ((long)cstr_info->packno == 0) {
              lVar9 = (long)cstr_info->tile[(long)pOVar12].end_header;
LAB_0013f429:
              lVar9 = lVar9 + 1;
            }
            else if (((((byte)local_48->field_0x1638 >> 2 |
                       *(byte *)((long)&local_60->m_specific_param + 0x18)) & 1) == 0) ||
                    (lVar9 = poVar8->start_pos, lVar9 == 0)) {
              lVar9 = poVar8[-1].end_pos;
              goto LAB_0013f429;
            }
            poVar8->start_pos = lVar9;
            poVar8->end_pos = (ulong)l_nb_bytes + lVar9 + -1;
            poVar8->end_ph_pos = lVar9 + poVar8->end_ph_pos + -1;
          }
          cstr_info->packno = cstr_info->packno + 1;
        }
        p_dest = p_dest + l_nb_bytes;
        p_max_len = p_max_len - l_nb_bytes;
        local_38->packno = local_38->packno + 1;
      }
      iVar4 = opj_pi_next(poVar6);
    }
    OVar5 = 1;
    poVar6 = local_78;
  }
LAB_0013f611:
  opj_pi_destroy(poVar6,OVar10);
  return OVar5;
}

Assistant:

OPJ_BOOL opj_t2_encode_packets(opj_t2_t* p_t2,
                               OPJ_UINT32 p_tile_no,
                               opj_tcd_tile_t *p_tile,
                               OPJ_UINT32 p_maxlayers,
                               OPJ_BYTE *p_dest,
                               OPJ_UINT32 * p_data_written,
                               OPJ_UINT32 p_max_len,
                               opj_codestream_info_t *cstr_info,
                               opj_tcd_marker_info_t* p_marker_info,
                               OPJ_UINT32 p_tp_num,
                               OPJ_INT32 p_tp_pos,
                               OPJ_UINT32 p_pino,
                               J2K_T2_MODE p_t2_mode,
                               opj_event_mgr_t *p_manager)
{
    OPJ_BYTE *l_current_data = p_dest;
    OPJ_UINT32 l_nb_bytes = 0;
    OPJ_UINT32 compno;
    OPJ_UINT32 poc;
    opj_pi_iterator_t *l_pi = 00;
    opj_pi_iterator_t *l_current_pi = 00;
    opj_image_t *l_image = p_t2->image;
    opj_cp_t *l_cp = p_t2->cp;
    opj_tcp_t *l_tcp = &l_cp->tcps[p_tile_no];
    OPJ_UINT32 pocno = (l_cp->rsiz == OPJ_PROFILE_CINEMA_4K) ? 2 : 1;
    OPJ_UINT32 l_max_comp = l_cp->m_specific_param.m_enc.m_max_comp_size > 0 ?
                            l_image->numcomps : 1;
    OPJ_UINT32 l_nb_pocs = l_tcp->numpocs + 1;

    l_pi = opj_pi_initialise_encode(l_image, l_cp, p_tile_no, p_t2_mode, p_manager);
    if (!l_pi) {
        return OPJ_FALSE;
    }

    * p_data_written = 0;

    if (p_t2_mode == THRESH_CALC) { /* Calculating threshold */
        l_current_pi = l_pi;

        for (compno = 0; compno < l_max_comp; ++compno) {
            OPJ_UINT32 l_comp_len = 0;
            l_current_pi = l_pi;

            for (poc = 0; poc < pocno ; ++poc) {
                OPJ_UINT32 l_tp_num = compno;

                /* TODO MSD : check why this function cannot fail (cf. v1) */
                opj_pi_create_encode(l_pi, l_cp, p_tile_no, poc, l_tp_num, p_tp_pos, p_t2_mode);

                if (l_current_pi->poc.prg == OPJ_PROG_UNKNOWN) {
                    /* TODO ADE : add an error */
                    opj_pi_destroy(l_pi, l_nb_pocs);
                    return OPJ_FALSE;
                }
                while (opj_pi_next(l_current_pi)) {
                    if (l_current_pi->layno < p_maxlayers) {
                        l_nb_bytes = 0;

                        if (! opj_t2_encode_packet(p_tile_no, p_tile, l_tcp, l_current_pi,
                                                   l_current_data, &l_nb_bytes,
                                                   p_max_len, cstr_info,
                                                   p_t2_mode,
                                                   p_manager)) {
                            opj_pi_destroy(l_pi, l_nb_pocs);
                            return OPJ_FALSE;
                        }

                        l_comp_len += l_nb_bytes;
                        l_current_data += l_nb_bytes;
                        p_max_len -= l_nb_bytes;

                        * p_data_written += l_nb_bytes;
                    }
                }

                if (l_cp->m_specific_param.m_enc.m_max_comp_size) {
                    if (l_comp_len > l_cp->m_specific_param.m_enc.m_max_comp_size) {
                        opj_pi_destroy(l_pi, l_nb_pocs);
                        return OPJ_FALSE;
                    }
                }

                ++l_current_pi;
            }
        }
    } else { /* t2_mode == FINAL_PASS  */
        opj_pi_create_encode(l_pi, l_cp, p_tile_no, p_pino, p_tp_num, p_tp_pos,
                             p_t2_mode);

        l_current_pi = &l_pi[p_pino];
        if (l_current_pi->poc.prg == OPJ_PROG_UNKNOWN) {
            /* TODO ADE : add an error */
            opj_pi_destroy(l_pi, l_nb_pocs);
            return OPJ_FALSE;
        }

        if (p_marker_info && p_marker_info->need_PLT) {
            /* One time use intended */
            assert(p_marker_info->packet_count == 0);
            assert(p_marker_info->p_packet_size == NULL);

            p_marker_info->p_packet_size = (OPJ_UINT32*) opj_malloc(
                                               opj_get_encoding_packet_count(l_image, l_cp, p_tile_no) * sizeof(OPJ_UINT32));
            if (p_marker_info->p_packet_size == NULL) {
                opj_pi_destroy(l_pi, l_nb_pocs);
                return OPJ_FALSE;
            }
        }

        while (opj_pi_next(l_current_pi)) {
            if (l_current_pi->layno < p_maxlayers) {
                l_nb_bytes = 0;

                if (! opj_t2_encode_packet(p_tile_no, p_tile, l_tcp, l_current_pi,
                                           l_current_data, &l_nb_bytes, p_max_len,
                                           cstr_info, p_t2_mode, p_manager)) {
                    opj_pi_destroy(l_pi, l_nb_pocs);
                    return OPJ_FALSE;
                }

                l_current_data += l_nb_bytes;
                p_max_len -= l_nb_bytes;

                * p_data_written += l_nb_bytes;

                if (p_marker_info && p_marker_info->need_PLT) {
                    p_marker_info->p_packet_size[p_marker_info->packet_count] = l_nb_bytes;
                    p_marker_info->packet_count ++;
                }

                /* INDEX >> */
                if (cstr_info) {
                    if (cstr_info->index_write) {
                        opj_tile_info_t *info_TL = &cstr_info->tile[p_tile_no];
                        opj_packet_info_t *info_PK = &info_TL->packet[cstr_info->packno];
                        if (!cstr_info->packno) {
                            info_PK->start_pos = info_TL->end_header + 1;
                        } else {
                            info_PK->start_pos = ((l_cp->m_specific_param.m_enc.m_tp_on | l_tcp->POC) &&
                                                  info_PK->start_pos) ? info_PK->start_pos : info_TL->packet[cstr_info->packno -
                                                                            1].end_pos + 1;
                        }
                        info_PK->end_pos = info_PK->start_pos + l_nb_bytes - 1;
                        info_PK->end_ph_pos += info_PK->start_pos -
                                               1;  /* End of packet header which now only represents the distance
                                                                                                                                                                                                                                                   to start of packet is incremented by value of start of packet*/
                    }

                    cstr_info->packno++;
                }
                /* << INDEX */
                ++p_tile->packno;
            }
        }
    }

    opj_pi_destroy(l_pi, l_nb_pocs);

    return OPJ_TRUE;
}